

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O2

void __thiscall Assimp::ASEImporter::ASEImporter(ASEImporter *this)

{
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0075af58;
  this->mParser = (Parser *)0x0;
  this->mBuffer = (char *)0x0;
  *(undefined8 *)((long)&this->mBuffer + 2) = 0;
  *(undefined8 *)((long)&this->pcScene + 2) = 0;
  return;
}

Assistant:

ASEImporter::ASEImporter()
: mParser()
, mBuffer()
, pcScene()
, configRecomputeNormals()
, noSkeletonMesh() {
    // empty
}